

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDEdge::VertexArrayIndex(ON_SubDEdge *this,ON_SubDVertex *v)

{
  ON_SubDVertex *v_local;
  ON_SubDEdge *this_local;
  
  if ((v == (ON_SubDVertex *)0x0) || (this->m_vertex[0] == this->m_vertex[1])) {
    this_local._4_4_ = 0xffffffff;
  }
  else if (v == this->m_vertex[0]) {
    this_local._4_4_ = 0;
  }
  else if (v == this->m_vertex[1]) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int ON_SubDEdge::VertexArrayIndex(const ON_SubDVertex * v) const
{
  if (nullptr == v || m_vertex[0] == m_vertex[1])
    return ON_UNSET_UINT_INDEX;
  if (v == m_vertex[0])
    return 0;
  if (v == m_vertex[1])
    return 1;
  return ON_UNSET_UINT_INDEX;
}